

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O2

void Wln_WriteAddPos(Wln_Ntk_t *p)

{
  int iVar1;
  int iObj;
  int i;
  
  for (i = 1; i < (p->vTypes).nSize; i = i + 1) {
    iVar1 = Wln_ObjIsCio(p,i);
    if (iVar1 == 0) {
      Wln_ObjCreateCo(p,i);
    }
  }
  return;
}

Assistant:

void Wln_WriteAddPos( Wln_Ntk_t * p )
{
    int iObj;
    Wln_NtkForEachObj( p, iObj )
        if ( !Wln_ObjIsCio(p, iObj) )
            Wln_ObjCreateCo( p, iObj );
}